

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O0

void set_type_bits(pcre2_real_code_8 *re,int cbit_type,uint table_limit)

{
  uint local_1c;
  uint32_t c;
  uint table_limit_local;
  int cbit_type_local;
  pcre2_real_code_8 *re_local;
  
  for (local_1c = 0; local_1c < table_limit; local_1c = local_1c + 1) {
    re->start_bitmap[local_1c] =
         re->start_bitmap[local_1c] | re->tables[local_1c + 0x200 + cbit_type];
  }
  return;
}

Assistant:

static void
set_type_bits(pcre2_real_code *re, int cbit_type, unsigned int table_limit)
{
uint32_t c;
for (c = 0; c < table_limit; c++)
  re->start_bitmap[c] |= re->tables[c+cbits_offset+cbit_type];
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
if (table_limit == 32) return;
for (c = 128; c < 256; c++)
  {
  if ((re->tables[cbits_offset + c/8] & (1u << (c&7))) != 0)
    {
    PCRE2_UCHAR buff[6];
    (void)PRIV(ord2utf)(c, buff);
    SET_BIT(buff[0]);
    }
  }
#endif  /* UTF-8 */
}